

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int tx_elements_token_from_bytes
              (uchar *entropy,size_t entropy_len,uchar *bytes,size_t bytes_len,uchar *bytes_out,
              size_t len)

{
  int iVar1;
  uchar buff [64];
  
  if ((bytes_out == (uchar *)0x20 && entropy_len == 0x20) &&
      (bytes_len != 0 && entropy != (uchar *)0x0)) {
    buff._0_8_ = *(undefined8 *)entropy;
    buff._8_8_ = *(undefined8 *)(entropy + 8);
    buff._16_8_ = *(undefined8 *)(entropy + 0x10);
    buff._24_8_ = *(undefined8 *)(entropy + 0x18);
    buff._32_8_ = *(undefined8 *)bytes;
    buff._40_8_ = *(undefined8 *)(bytes + 8);
    buff._48_8_ = *(undefined8 *)(bytes + 0x10);
    buff._56_8_ = *(undefined8 *)(bytes + 0x18);
    iVar1 = wally_sha256_midstate(buff,0x40,(uchar *)bytes_len,0x20);
    wally_clear(buff,0x40);
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

static int tx_elements_token_from_bytes(const unsigned char *entropy,
                                        size_t entropy_len,
                                        const unsigned char *bytes,
                                        size_t bytes_len,
                                        unsigned char *bytes_out,
                                        size_t len)
{
    unsigned char buff[2 * SHA256_LEN];
    int ret;

    if (!entropy || entropy_len != SHA256_LEN ||
        !bytes_len || bytes_len != SHA256_LEN ||
        !bytes_out || len != SHA256_LEN)
        return WALLY_EINVAL;

    memcpy(buff, entropy, entropy_len);
    memcpy(buff + SHA256_LEN, bytes, bytes_len);

    ret = wally_sha256_midstate(buff, sizeof(buff), bytes_out, len);
    wally_clear(buff, sizeof(buff));

    return ret;
}